

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void ga_acc_twist_tf_ref_to_tgt(ga_pose *x,ga_acc_twist *xdd,ga_acc_twist *r)

{
  frame *pfVar1;
  body *pbVar2;
  
  if (x == (ga_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x14c,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xdd == (ga_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x14d,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (r == (ga_acc_twist *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x14e,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xdd->point == (point *)0x0) {
    __assert_fail("xdd->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x14f,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  pfVar1 = xdd->frame;
  if (pfVar1 == (frame *)0x0) {
    __assert_fail("xdd->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x150,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xdd == r) {
    __assert_fail("xdd != r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x151,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xdd->point != pfVar1->origin) {
    __assert_fail("xdd->point == xdd->frame->origin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x152,
                  "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (pfVar1 == x->reference_frame) {
    pbVar2 = xdd->reference_body;
    r->target_body = xdd->target_body;
    r->reference_body = pbVar2;
    pfVar1 = x->target_frame;
    r->frame = pfVar1;
    r->point = pfVar1->origin;
    return;
  }
  __assert_fail("xdd->frame == x->reference_frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x153,
                "void ga_acc_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_acc_twist *, struct ga_acc_twist *)"
               );
}

Assistant:

void ga_acc_twist_tf_ref_to_tgt(
        const struct ga_pose *x,
        const struct ga_acc_twist *xdd,
        struct ga_acc_twist *r)
{
    assert(x);
    assert(xdd);
    assert(r);
    assert(xdd->point);
    assert(xdd->frame);
    assert(xdd != r);
    assert(xdd->point == xdd->frame->origin);        // screw twist
    assert(xdd->frame == x->reference_frame);

    r->target_body = xdd->target_body;
    r->reference_body = xdd->reference_body;
    r->frame = x->target_frame;
    r->point = r->frame->origin;
}